

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.cc
# Opt level: O3

ostream * std::operator<<(ostream *os,vector3h *v)

{
  float fVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"(",1);
  fVar1 = tinyusdz::value::half_to_float((half)(v->x).value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)(v->y).value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  fVar1 = tinyusdz::value::half_to_float((half)(v->z).value);
  std::ostream::_M_insert<double>((double)fVar1);
  std::__ostream_insert<char,std::char_traits<char>>(os,")",1);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const tinyusdz::value::vector3h &v) {
  os << "(" << v.x << ", " << v.y << ", " << v.z << ")";
  return os;
}